

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O0

bool __thiscall GGSock::FileServer::Impl::updateClientInfos(Impl *this)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  Communicator *in_RDI;
  key_type_conflict *in_stack_00000008;
  map<int,_GGSock::FileServer::ClientInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::ClientInfo>_>_>
  *in_stack_00000010;
  value_type *client;
  int i;
  ClientInfo *in_stack_ffffffffffffffc8;
  int local_c;
  
  std::
  map<int,_GGSock::FileServer::ClientInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::ClientInfo>_>_>
  ::clear((map<int,_GGSock::FileServer::ClientInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::ClientInfo>_>_>
           *)0x137adf);
  for (local_c = 0;
      sVar2 = std::vector<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>::size
                        ((vector<GGSock::ClientData,_std::allocator<GGSock::ClientData>_> *)
                         (in_RDI + 0xc)), local_c < (int)sVar2; local_c = local_c + 1) {
    this_00 = std::vector<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>::operator[]
                        ((vector<GGSock::ClientData,_std::allocator<GGSock::ClientData>_> *)
                         (in_RDI + 0xc),(long)local_c);
    std::__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x137b31);
    bVar1 = Communicator::isConnected(in_RDI);
    if (bVar1) {
      std::
      map<int,_GGSock::FileServer::ClientInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::ClientInfo>_>_>
      ::operator[](in_stack_00000010,in_stack_00000008);
      ClientInfo::operator=(&this_00->info,in_stack_ffffffffffffffc8);
    }
  }
  return true;
}

Assistant:

bool updateClientInfos() {
        clientInfos.clear();

        for (int i = 0; i < (int) clients.size(); ++i) {
            const auto & client = clients[i];
            if (client.communicator->isConnected() == false) {
                continue;
            }

            clientInfos[i] = client.info;
        }

        return true;
    }